

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_geom.cxx
# Opt level: O3

void __thiscall xray_re::xr_level_geom::load_v9(xr_level_geom *this,xr_reader *r)

{
  uint uVar1;
  uint32_t fvf;
  uint *puVar2;
  pointer pxVar3;
  d3d_vertex_element *ve;
  d3d_vertex_element *pdVar4;
  uint32_t *puVar5;
  pointer pxVar6;
  bool bVar7;
  xr_reader *pxVar8;
  d3d_vertex_element *pdVar9;
  size_t n_ve;
  pointer pxVar10;
  pointer this_00;
  xr_reader *s;
  xr_reader *local_30;
  
  pxVar8 = xr_reader::open_chunk(r,0xc);
  local_30 = pxVar8;
  if (pxVar8 == (xr_reader *)0x0) {
    pxVar8 = xr_reader::open_chunk(r,4);
    local_30 = pxVar8;
    if (pxVar8 == (xr_reader *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_geom.cxx"
                    ,0x22,"void xray_re::xr_level_geom::load_v9(xr_reader &)");
    }
    puVar2 = (pxVar8->field_2).m_p_u32;
    (pxVar8->field_2).m_p = (uint8_t *)(puVar2 + 1);
    std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>::resize
              (&this->m_vbufs,(ulong)*puVar2);
    pxVar3 = (this->m_vbufs).super__Vector_base<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pxVar10 = (this->m_vbufs).
                   super__Vector_base<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>._M_impl.
                   super__Vector_impl_data._M_start; pxVar10 != pxVar3; pxVar10 = pxVar10 + 1) {
      puVar5 = (pxVar8->field_2).m_p_u32;
      (pxVar8->field_2).m_p = (uint8_t *)(puVar5 + 1);
      fvf = *puVar5;
      (pxVar8->field_2).m_p = (uint8_t *)(puVar5 + 2);
      xr_vbuf::load_d3d7(pxVar10,pxVar8,(ulong)puVar5[1],fvf);
    }
  }
  else {
    puVar2 = (pxVar8->field_2).m_p_u32;
    (pxVar8->field_2).m_p = (uint8_t *)(puVar2 + 1);
    std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>::resize
              (&this->m_vbufs,(ulong)*puVar2);
    pxVar3 = (this->m_vbufs).super__Vector_base<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pxVar10 = (this->m_vbufs).
                   super__Vector_base<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>._M_impl.
                   super__Vector_impl_data._M_start; pxVar10 != pxVar3; pxVar10 = pxVar10 + 1) {
      ve = (d3d_vertex_element *)(pxVar8->field_2).m_p;
      pdVar4 = (d3d_vertex_element *)pxVar8->m_end;
      (pxVar8->field_2).m_p = (uint8_t *)(ve + 1);
      if ((pdVar4 < ve + 1) || ((pxVar8->field_2).m_p = (uint8_t *)(ve + 2), pdVar4 < ve + 2)) {
LAB_00169aea:
        __assert_fail("m_p <= m_end",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.h"
                      ,0x7c,"void xray_re::xr_reader::advance(size_t)");
      }
      n_ve = 1;
      pdVar9 = ve + 3;
      while (pdVar9[-2].type != '\x11') {
        n_ve = n_ve + 1;
        (pxVar8->field_2).m_p = (uint8_t *)pdVar9;
        bVar7 = pdVar4 < pdVar9;
        pdVar9 = pdVar9 + 1;
        if (bVar7) goto LAB_00169aea;
      }
      (pxVar8->field_2).m_p = &pdVar9[-1].type;
      uVar1._0_2_ = pdVar9[-1].stream;
      uVar1._2_2_ = pdVar9[-1].offset;
      xr_vbuf::load_d3d9(pxVar10,pxVar8,(ulong)uVar1,ve,n_ve);
    }
  }
  xr_reader::close_chunk(r,&local_30);
  local_30 = xr_reader::open_chunk(r,0xb);
  if (local_30 == (xr_reader *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_geom.cxx"
                  ,0x2d,"void xray_re::xr_level_geom::load_v9(xr_reader &)");
  }
  puVar2 = (local_30->field_2).m_p_u32;
  (local_30->field_2).m_p = (uint8_t *)(puVar2 + 1);
  std::vector<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>::resize
            (&this->m_ibufs,(ulong)*puVar2);
  pxVar6 = (this->m_ibufs).super__Vector_base<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->m_ibufs).
                 super__Vector_base<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pxVar6; this_00 = this_00 + 1) {
    puVar2 = (local_30->field_2).m_p_u32;
    (local_30->field_2).m_p = (uint8_t *)(puVar2 + 1);
    xr_ibuf::load(this_00,local_30,(ulong)*puVar2);
  }
  xr_reader::close_chunk(r,&local_30);
  return;
}

Assistant:

void xr_level_geom::load_v9(xr_reader& r)
{
	xr_reader* s = r.open_chunk(FSL9_VB);
	if (s) {
		m_vbufs.resize(s->r_u32());
		for (xr_vbuf_vec_it it = m_vbufs.begin(), end = m_vbufs.end(); it != end; ++it) {
			const d3d_vertex_element *ve = s->skip<d3d_vertex_element>();
			size_t n_ve = 1;
			for (; s->skip<d3d_vertex_element>()->type != D3D_VE_TYPE_UNUSED; ++n_ve) {}
			it->load_d3d9(*s, s->r_u32(), ve, n_ve);
		}
		r.close_chunk(s);
	} else {
		s = r.open_chunk(FSL9_VB_OLD);
		xr_assert(s);
		m_vbufs.resize(s->r_u32());
		for (xr_vbuf_vec_it it = m_vbufs.begin(), end = m_vbufs.end(); it != end; ++it) {
			uint32_t fvf = s->r_u32();
			size_t n = s->r_u32();
			it->load_d3d7(*s, n, fvf);
		}
		r.close_chunk(s);
	}

	s = r.open_chunk(FSL9_IB);
	xr_assert(s);
	m_ibufs.resize(s->r_u32());
	for (xr_ibuf_vec_it it = m_ibufs.begin(), end = m_ibufs.end(); it != end; ++it)
		it->load(*s, s->r_u32());
	r.close_chunk(s);
}